

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::set_pattern
          (ansicolor_sink<spdlog::details::console_mutex> *this,string *pattern)

{
  string *in_RSI;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff18;
  lock_guard<std::mutex> *in_stack_ffffffffffffff20;
  __uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *this_00;
  __uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_> local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  custom_flags *custom_user_flags;
  string *eol;
  pattern_time_type in_stack_ffffffffffffff84;
  string *in_stack_ffffffffffffff88;
  pattern_formatter *in_stack_ffffffffffffff90;
  string local_50 [64];
  string *local_10;
  
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  operator_new(0xe0);
  std::__cxx11::string::string(local_50,local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff90,"\n",(allocator *)&stack0xffffffffffffff8f);
  local_98 = 0;
  custom_user_flags = (custom_flags *)0x0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8._M_t.super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>
  .super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl =
       (tuple<spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>)
       (_Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>)0x0;
  uStack_b0 = 0;
  eol = (string *)0x0;
  this_00 = &local_b8;
  std::
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  ::unordered_map((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                   *)0x19f3b6);
  pattern_formatter::pattern_formatter
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,eol,
             custom_user_flags);
  std::unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>>::
  unique_ptr<std::default_delete<spdlog::formatter>,void>
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)this_00,
             (pointer)in_stack_ffffffffffffff18);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator=
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)this_00,
             (unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
             in_stack_ffffffffffffff18);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr(in_RDI);
  std::
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  ::~unordered_map((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                    *)0x19f41d);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  std::__cxx11::string::~string(local_50);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x19f44b);
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_pattern(const std::string &pattern)
{
    std::lock_guard<mutex_t> lock(mutex_);
    formatter_ = std::unique_ptr<spdlog::formatter>(new pattern_formatter(pattern));
}